

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

void __thiscall libtorrent::piece_picker::lock_piece(piece_picker *this,piece_index_t piece)

{
  uchar uVar1;
  uchar uVar2;
  bool bVar3;
  value_type *this_00;
  vector<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>
  *this_01;
  pointer pdVar4;
  __normal_iterator<libtorrent::piece_picker::downloading_piece_*,_std::vector<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>_>
  local_38;
  int local_30;
  uchar local_29;
  __normal_iterator<libtorrent::piece_picker::downloading_piece_*,_std::vector<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>_>
  local_28;
  iterator i;
  download_queue_t state;
  piece_picker *this_local;
  piece_index_t piece_local;
  
  i._M_current._0_4_ = piece.m_val;
  this_00 = libtorrent::aux::
            container_wrapper<libtorrent::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>_>
            ::operator[](&this->m_piece_map,
                         (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)piece.m_val);
  i._M_current._7_1_ = piece_pos::download_queue(this_00);
  uVar1 = libtorrent::aux::strong_typedef::operator_cast_to_unsigned_char
                    ((strong_typedef *)((long)&i._M_current + 7));
  uVar2 = libtorrent::aux::strong_typedef::operator_cast_to_unsigned_char
                    ((strong_typedef *)&piece_pos::piece_open);
  if (uVar1 != uVar2) {
    local_29 = i._M_current._7_1_;
    local_30 = piece.m_val;
    local_28._M_current = (downloading_piece *)find_dl_piece(this,i._M_current._7_1_,piece);
    this_01 = &libtorrent::aux::
               container_wrapper<libtorrent::aux::container_wrapper<libtorrent::piece_picker::downloading_piece,_int,_std::vector<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>_>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::dl_queue_tag,_void>,_std::array<libtorrent::aux::container_wrapper<libtorrent::piece_picker::downloading_piece,_int,_std::vector<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>_>,_4UL>_>
               ::operator[](&this->m_downloads,
                            (strong_typedef<unsigned_char,_libtorrent::dl_queue_tag,_void>)
                            i._M_current._7_1_)->
               super_vector<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>
    ;
    local_38._M_current =
         (downloading_piece *)
         std::
         vector<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>
         ::end(this_01);
    bVar3 = __gnu_cxx::operator==(&local_28,&local_38);
    if (!bVar3) {
      pdVar4 = __gnu_cxx::
               __normal_iterator<libtorrent::piece_picker::downloading_piece_*,_std::vector<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>_>
               ::operator->(&local_28);
      if ((*(uint *)&pdVar4->field_0x6 >> 0xf & 1) != 0) {
        pdVar4 = __gnu_cxx::
                 __normal_iterator<libtorrent::piece_picker::downloading_piece_*,_std::vector<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>_>
                 ::operator->(&local_28);
        *(uint *)&pdVar4->field_0x6 = *(uint *)&pdVar4->field_0x6 & 0xffff7fff;
        this->m_num_passed = this->m_num_passed + -1;
      }
      pdVar4 = __gnu_cxx::
               __normal_iterator<libtorrent::piece_picker::downloading_piece_*,_std::vector<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>_>
               ::operator->(&local_28);
      *(uint *)&pdVar4->field_0x6 = *(uint *)&pdVar4->field_0x6 & 0x7fffffff | 0x80000000;
    }
  }
  return;
}

Assistant:

void piece_picker::lock_piece(piece_index_t const piece)
	{
		INVARIANT_CHECK;

#if TORRENT_USE_INVARIANT_CHECKS
		check_piece_state();
#endif

#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "lock_piece(" << piece << ")" << std::endl;
#endif

		auto const state = m_piece_map[piece].download_queue();
		if (state == piece_pos::piece_open) return;
		auto const i = find_dl_piece(state, piece);
		if (i == m_downloads[state].end()) return;

		TORRENT_ASSERT(i->passed_hash_check == false);
		if (i->passed_hash_check)
		{
			// it's not clear why this would happen,
			// but it seems reasonable to not break the
			// accounting over it.
			i->passed_hash_check = false;
			TORRENT_ASSERT(m_num_passed > 0);
			--m_num_passed;
		}

		// prevent this piece from being picked until it's restored
		i->locked = true;
	}